

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletutil.cpp
# Opt level: O0

path * wallet::GetWalletDir(void)

{
  byte bVar1;
  bool bVar2;
  ArgsManager *in_RDI;
  long in_FS_OFFSET;
  path *path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe68;
  ArgsManager *in_stack_fffffffffffffe70;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  path *p1;
  string *in_stack_fffffffffffffe88;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  ArgsManager *this;
  allocator<char> local_112;
  allocator<char> local_111 [81];
  path local_c0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  fs::path::path((path *)in_stack_fffffffffffffe68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             (char *)in_RDI,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
  bVar1 = ArgsManager::IsArgSet
                    ((ArgsManager *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                     in_stack_fffffffffffffe88);
  std::__cxx11::string::~string(in_stack_fffffffffffffe68);
  std::allocator<char>::~allocator(local_111);
  if ((bVar1 & 1) == 0) {
    ArgsManager::GetDataDirNet(in_stack_fffffffffffffe70);
    p1 = &local_c0;
    fs::path::operator=((path *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                        (path *)in_stack_fffffffffffffe70);
    fs::path::~path((path *)in_stack_fffffffffffffe68);
    fs::path::path((path *)in_stack_fffffffffffffe68,(path *)0x17a6cb1);
    fs::operator/(p1,(char *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
    bVar1 = std::filesystem::is_directory
                      ((path *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
    fs::path::~path((path *)in_stack_fffffffffffffe68);
    fs::path::~path((path *)in_stack_fffffffffffffe68);
    if ((bVar1 & 1) != 0) {
      fs::path::operator/=
                ((path *)in_stack_fffffffffffffe70,(char *)CONCAT17(bVar1,in_stack_fffffffffffffe78)
                );
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
               (char *)in_RDI,(allocator<char> *)CONCAT17(bVar1,in_stack_fffffffffffffea8));
    local_88 = 0;
    uStack_80 = 0;
    local_98 = 0;
    uStack_90 = 0;
    local_78 = 0;
    fs::path::path((path *)in_stack_fffffffffffffe68);
    ArgsManager::GetPathArg(this,(string *)in_RDI,(path *)CONCAT17(bVar1,in_stack_fffffffffffffea8))
    ;
    fs::path::operator=((path *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                        (path *)in_stack_fffffffffffffe70);
    fs::path::~path((path *)in_stack_fffffffffffffe68);
    fs::path::~path((path *)in_stack_fffffffffffffe68);
    std::__cxx11::string::~string(in_stack_fffffffffffffe68);
    std::allocator<char>::~allocator(&local_112);
    bVar2 = std::filesystem::is_directory
                      ((path *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
    if (!bVar2) {
      fs::path::operator=((path *)in_stack_fffffffffffffe70,
                          (char *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (path *)this;
  }
  __stack_chk_fail();
}

Assistant:

fs::path GetWalletDir()
{
    fs::path path;

    if (gArgs.IsArgSet("-walletdir")) {
        path = gArgs.GetPathArg("-walletdir");
        if (!fs::is_directory(path)) {
            // If the path specified doesn't exist, we return the deliberately
            // invalid empty string.
            path = "";
        }
    } else {
        path = gArgs.GetDataDirNet();
        // If a wallets directory exists, use that, otherwise default to GetDataDir
        if (fs::is_directory(path / "wallets")) {
            path /= "wallets";
        }
    }

    return path;
}